

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O0

REF_STATUS
ref_search_distance3(REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz2,REF_DBL *xyz,REF_DBL *distance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  REF_DBL local_150;
  REF_DBL local_148;
  double local_140;
  double local_130;
  double local_128;
  double local_118;
  double local_110;
  double local_100;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL xyzp [3];
  REF_DBL dxyz [3];
  double local_98;
  REF_DBL normal [3];
  double local_78;
  REF_DBL total_normal [3];
  REF_DBL total;
  REF_DBL bary [3];
  REF_DBL dist;
  REF_DBL *distance_local;
  REF_DBL *xyz_local;
  REF_DBL *xyz2_local;
  REF_DBL *xyz1_local;
  REF_DBL *xyz0_local;
  
  xyz0_local._4_4_ = ref_search_xyz_normal(xyz0,xyz1,xyz2,&local_78);
  if (xyz0_local._4_4_ == 0) {
    total_normal[2] =
         (xyz[2] - xyz0[2]) * total_normal[1] +
         (*xyz - *xyz0) * local_78 + (xyz[1] - xyz0[1]) * total_normal[0];
    _ref_private_macro_code_rss_1 = *xyz0 + -local_78 * total_normal[2] + (*xyz - *xyz0);
    xyzp[0] = xyz0[1] + -total_normal[0] * total_normal[2] + (xyz[1] - xyz0[1]);
    xyzp[1] = xyz0[2] + -total_normal[1] * total_normal[2] + (xyz[2] - xyz0[2]);
    xyz0_local._4_4_ =
         ref_search_xyz_normal((REF_DBL *)&ref_private_macro_code_rss_1,xyz1,xyz2,&local_98);
    if (xyz0_local._4_4_ == 0) {
      dVar1 = normal[1] * total_normal[1] + local_98 * local_78 + normal[0] * total_normal[0];
      xyz0_local._4_4_ =
           ref_search_xyz_normal(xyz0,(REF_DBL *)&ref_private_macro_code_rss_1,xyz2,&local_98);
      if (xyz0_local._4_4_ == 0) {
        bary[0] = normal[1] * total_normal[1] + local_98 * local_78 + normal[0] * total_normal[0];
        xyz0_local._4_4_ =
             ref_search_xyz_normal(xyz0,xyz1,(REF_DBL *)&ref_private_macro_code_rss_1,&local_98);
        if (xyz0_local._4_4_ == 0) {
          bary[1] = normal[1] * total_normal[1] + local_98 * local_78 + normal[0] * total_normal[0];
          total_normal[2] = dVar1 + bary[0] + bary[1];
          if (total_normal[2] * 1e+20 <= 0.0) {
            local_100 = -(total_normal[2] * 1e+20);
          }
          else {
            local_100 = total_normal[2] * 1e+20;
          }
          local_110 = dVar1;
          if (dVar1 <= 0.0) {
            local_110 = -dVar1;
          }
          if (local_110 < local_100) {
            if (total_normal[2] * 1e+20 <= 0.0) {
              local_118 = -(total_normal[2] * 1e+20);
            }
            else {
              local_118 = total_normal[2] * 1e+20;
            }
            if (bary[0] <= 0.0) {
              local_128 = -bary[0];
            }
            else {
              local_128 = bary[0];
            }
            if (local_128 < local_118) {
              if (total_normal[2] * 1e+20 <= 0.0) {
                local_130 = -(total_normal[2] * 1e+20);
              }
              else {
                local_130 = total_normal[2] * 1e+20;
              }
              local_140 = bary[1];
              if (bary[1] <= 0.0) {
                local_140 = -bary[1];
              }
              if (local_140 < local_130) {
                dVar1 = dVar1 / total_normal[2];
                bary[0] = bary[0] / total_normal[2];
                bary[1] = bary[1] / total_normal[2];
                if (((0.0 <= dVar1) && (0.0 <= bary[0])) && (0.0 <= bary[1])) {
                  dVar2 = (bary[1] * *xyz2 + dVar1 * *xyz0 + bary[0] * *xyz1) - *xyz;
                  dVar3 = (bary[1] * xyz2[1] + dVar1 * xyz0[1] + bary[0] * xyz1[1]) - xyz[1];
                  dVar1 = (bary[1] * xyz2[2] + dVar1 * xyz0[2] + bary[0] * xyz1[2]) - xyz[2];
                  dVar1 = sqrt(dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3);
                  *distance = dVar1;
                  return 0;
                }
              }
            }
          }
          xyz0_local._4_4_ = ref_search_distance2(xyz0,xyz1,xyz,bary + 2);
          if (xyz0_local._4_4_ == 0) {
            *distance = bary[2];
            xyz0_local._4_4_ = ref_search_distance2(xyz1,xyz2,xyz,bary + 2);
            if (xyz0_local._4_4_ == 0) {
              if (bary[2] <= *distance) {
                local_148 = bary[2];
              }
              else {
                local_148 = *distance;
              }
              *distance = local_148;
              xyz0_local._4_4_ = ref_search_distance2(xyz2,xyz0,xyz,bary + 2);
              if (xyz0_local._4_4_ == 0) {
                if (bary[2] <= *distance) {
                  local_150 = bary[2];
                }
                else {
                  local_150 = *distance;
                }
                *distance = local_150;
                xyz0_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                       ,0x22b,"ref_search_distance3",(ulong)xyz0_local._4_4_,"e20");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                     ,0x229,"ref_search_distance3",(ulong)xyz0_local._4_4_,"e12");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                   ,0x227,"ref_search_distance3",(ulong)xyz0_local._4_4_,"e01");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
                 0x210,"ref_search_distance3",(ulong)xyz0_local._4_4_,"n2");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
               0x20e,"ref_search_distance3",(ulong)xyz0_local._4_4_,"n1");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
             0x20c,"ref_search_distance3",(ulong)xyz0_local._4_4_,"n0");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x1fe,
           "ref_search_distance3",(ulong)xyz0_local._4_4_,"n0");
  }
  return xyz0_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_search_distance3(REF_DBL *xyz0, REF_DBL *xyz1,
                                        REF_DBL *xyz2, REF_DBL *xyz,
                                        REF_DBL *distance) {
  REF_DBL dist;
  REF_DBL bary[3], total, total_normal[3], normal[3];
  REF_DBL dxyz[3];
  REF_DBL xyzp[3];

  RSS(ref_search_xyz_normal(xyz0, xyz1, xyz2, total_normal), "n0");

  /* projects query point to triangle plane */
  xyzp[0] = xyz[0] - xyz0[0];
  xyzp[1] = xyz[1] - xyz0[1];
  xyzp[2] = xyz[2] - xyz0[2];
  total = ref_math_dot(xyzp, total_normal);
  xyzp[0] -= total_normal[0] * total;
  xyzp[1] -= total_normal[1] * total;
  xyzp[2] -= total_normal[2] * total;
  xyzp[0] += xyz0[0];
  xyzp[1] += xyz0[1];
  xyzp[2] += xyz0[2];

  RSS(ref_search_xyz_normal(xyzp, xyz1, xyz2, normal), "n0");
  bary[0] = ref_math_dot(normal, total_normal);
  RSS(ref_search_xyz_normal(xyz0, xyzp, xyz2, normal), "n1");
  bary[1] = ref_math_dot(normal, total_normal);
  RSS(ref_search_xyz_normal(xyz0, xyz1, xyzp, normal), "n2");
  bary[2] = ref_math_dot(normal, total_normal);

  total = bary[0] + bary[1] + bary[2];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
    if (bary[0] >= 0.0 && bary[1] >= 0.0 && bary[2] >= 0.0) {
      dxyz[0] =
          bary[0] * xyz0[0] + bary[1] * xyz1[0] + bary[2] * xyz2[0] - xyz[0];
      dxyz[1] =
          bary[0] * xyz0[1] + bary[1] * xyz1[1] + bary[2] * xyz2[1] - xyz[1];
      dxyz[2] =
          bary[0] * xyz0[2] + bary[1] * xyz1[2] + bary[2] * xyz2[2] - xyz[2];
      *distance = sqrt(ref_math_dot(dxyz, dxyz));
      return REF_SUCCESS;
    }
  }

  RSS(ref_search_distance2(xyz0, xyz1, xyz, &dist), "e01");
  *distance = dist;
  RSS(ref_search_distance2(xyz1, xyz2, xyz, &dist), "e12");
  *distance = MIN(*distance, dist);
  RSS(ref_search_distance2(xyz2, xyz0, xyz, &dist), "e20");
  *distance = MIN(*distance, dist);

  return REF_SUCCESS;
}